

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O0

void * embree::os_malloc(size_t bytes,bool *hugepages)

{
  undefined8 uVar1;
  undefined1 *in_RSI;
  ulong in_RDI;
  bool bVar2;
  void *ptr;
  void *ptr_1;
  size_t hbytes;
  size_t in_stack_ffffffffffffffb8;
  bad_alloc *local_20;
  
  if (in_RDI == 0) {
    *in_RSI = 0;
    local_20 = (bad_alloc *)0x0;
  }
  else {
    if ((huge_pages_enabled & 1) == 0) {
      bVar2 = false;
    }
    else {
      bVar2 = ((in_RDI + 0x1fffff & 0xffffffffffe00000) - in_RDI) * 0x42 < in_RDI;
    }
    if ((bVar2) &&
       (local_20 = (bad_alloc *)mmap((void *)0x0,in_RDI,3,0x40022,-1,0),
       local_20 != (bad_alloc *)0xffffffffffffffff)) {
      *in_RSI = 1;
    }
    else {
      local_20 = (bad_alloc *)mmap((void *)0x0,in_RDI,3,0x22,-1,0);
      if (local_20 == (bad_alloc *)0xffffffffffffffff) {
        uVar1 = __cxa_allocate_exception(8);
        std::bad_alloc::bad_alloc(local_20);
        __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      *in_RSI = 0;
      os_advise(local_20,in_stack_ffffffffffffffb8);
    }
  }
  return local_20;
}

Assistant:

void* os_malloc(size_t bytes, bool& hugepages)
  { 
    if (bytes == 0) {
      hugepages = false;
      return nullptr;
    }

    /* try direct huge page allocation first */
    if (isHugePageCandidate(bytes)) 
    {
#if defined(__MACOSX__)
      void* ptr = mmap(0, bytes, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANON, VM_FLAGS_SUPERPAGE_SIZE_2MB, 0);
      if (ptr != MAP_FAILED) {
        hugepages = true;
        return ptr;
      }
#elif defined(MAP_HUGETLB)
      void* ptr = mmap(0, bytes, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANON | MAP_HUGETLB, -1, 0);
      if (ptr != MAP_FAILED) {
        hugepages = true;
        return ptr;
      }
#endif
    } 

    /* fallback to 4k pages */
    void* ptr = (char*) mmap(0, bytes, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANON, -1, 0);
    if (ptr == MAP_FAILED) throw std::bad_alloc();
    hugepages = false;

    /* advise huge page hint for THP */
    os_advise(ptr,bytes);
    return ptr;
  }